

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

void cpu_mips_store_status_mips(CPUMIPSState *env,target_ulong_conflict val)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uStack_18;
  _Bool has_supervisor;
  target_ulong_conflict old;
  uint32_t mask;
  target_ulong_conflict val_local;
  CPUMIPSState *env_local;
  
  uStack_18 = env->CP0_Status_rw_bitmask;
  uVar1 = env->CP0_Status;
  if ((env->insn_flags & 0x2000) != 0) {
    uVar2 = extract32(uStack_18,3,2);
    if (uVar2 == 3) {
      uVar2 = extract32(val,3,2);
      if (uVar2 == 3) {
        uStack_18 = uStack_18 & 0xffffffe7;
      }
    }
    uStack_18 = (val & 0x180000 ^ 0xffffffff) & uStack_18;
  }
  env->CP0_Status = uVar1 & (uStack_18 ^ 0xffffffff) | val & uStack_18;
  if ((env->CP0_Config3 & 4U) == 0) {
    compute_hflags(env);
  }
  else {
    sync_c0_status_mips(env,env,env->current_tc);
  }
  return;
}

Assistant:

void cpu_mips_store_status(CPUMIPSState *env, target_ulong val)
{
    uint32_t mask = env->CP0_Status_rw_bitmask;
    target_ulong old = env->CP0_Status;

    if (env->insn_flags & ISA_MIPS32R6) {
        bool has_supervisor = extract32(mask, CP0St_KSU, 2) == 0x3;
#if defined(TARGET_MIPS64)
        uint32_t ksux = (1 << CP0St_KX) & val;
        ksux |= (ksux >> 1) & val; /* KX = 0 forces SX to be 0 */
        ksux |= (ksux >> 1) & val; /* SX = 0 forces UX to be 0 */
        val = (val & ~(7 << CP0St_UX)) | ksux;
#endif
        if (has_supervisor && extract32(val, CP0St_KSU, 2) == 0x3) {
            mask &= ~(3 << CP0St_KSU);
        }
        mask &= ~(((1 << CP0St_SR) | (1 << CP0St_NMI)) & val);
    }

    env->CP0_Status = (old & ~mask) | (val & mask);
#if defined(TARGET_MIPS64)
    if ((env->CP0_Status ^ old) & (old & (7 << CP0St_UX))) {
        /* Access to at least one of the 64-bit segments has been disabled */
        tlb_flush(env_cpu(env));
    }
#endif
    if (env->CP0_Config3 & (1 << CP0C3_MT)) {
        sync_c0_status(env, env, env->current_tc);
    } else {
        compute_hflags(env);
    }
}